

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Watcher.cpp
# Opt level: O3

void __thiscall
efsw::Watcher::Watcher
          (Watcher *this,WatchID id,string *directory,FileWatchListener *listener,bool recursive)

{
  pointer pcVar1;
  
  this->_vptr_Watcher = (_func_int **)&PTR__Watcher_0011ec90;
  this->ID = id;
  (this->Directory)._M_dataplus._M_p = (pointer)&(this->Directory).field_2;
  pcVar1 = (directory->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Directory,pcVar1,pcVar1 + directory->_M_string_length);
  this->Listener = listener;
  this->Recursive = recursive;
  (this->OldFileName)._M_dataplus._M_p = (pointer)&(this->OldFileName).field_2;
  (this->OldFileName)._M_string_length = 0;
  (this->OldFileName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Watcher::Watcher( WatchID id, std::string directory, FileWatchListener* listener, bool recursive ) :
	ID( id ), Directory( directory ), Listener( listener ), Recursive( recursive ) {}